

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O0

void duckdb::StandardFixedSizeAppend::Append<double>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  bool bVar1;
  double *pdVar2;
  idx_t iVar3;
  BaseStatistics *this;
  UnifiedVectorFormat *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  ulong in_R9;
  double dVar4;
  idx_t target_idx_1;
  idx_t source_idx_1;
  idx_t i_1;
  bool is_null;
  idx_t target_idx;
  idx_t source_idx;
  idx_t i;
  double *tdata;
  double *sdata;
  double in_stack_ffffffffffffff88;
  BaseStatistics *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  ulong uVar5;
  ulong local_48;
  
  pdVar2 = UnifiedVectorFormat::GetData<double>(in_RCX);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    (&(in_RCX->validity).super_TemplatedValidityMask<unsigned_long>);
  if (bVar1) {
    for (uVar5 = 0; uVar5 < in_R9; uVar5 = uVar5 + 1) {
      this = (BaseStatistics *)SelectionVector::get_index(in_RCX->sel,in_R8 + uVar5);
      dVar4 = (double)(in_RDX + uVar5);
      BaseStatistics::UpdateNumericStats<double>(this,dVar4);
      *(double *)(in_RSI + (long)dVar4 * 8) = pdVar2[(long)this];
    }
  }
  else {
    for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
      iVar3 = SelectionVector::get_index(in_RCX->sel,in_R8 + local_48);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        BaseStatistics::UpdateNumericStats<double>
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        *(double *)(in_RSI + (in_RDX + local_48) * 8) = pdVar2[iVar3];
      }
      else {
        dVar4 = NullValue<double>();
        *(double *)(in_RSI + (in_RDX + local_48) * 8) = dVar4;
      }
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}